

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void alist_restore_gpointers(t_alist *x,int offset,int count)

{
  t_listelem *ptVar1;
  t_gpointer *ptVar2;
  bool bVar3;
  
  ptVar1 = x->l_vec + offset;
  while (ptVar2 = &ptVar1->l_p, bVar3 = count != 0, count = count + -1, bVar3) {
    if (*(int *)((long)(ptVar2 + -1) + 8) == 3) {
      *(t_gpointer **)((long)(ptVar2 + -1) + 0x10) = ptVar2;
    }
    ptVar1 = (t_listelem *)(ptVar2 + 1);
  }
  return;
}

Assistant:

static void alist_restore_gpointers(t_alist *x, int offset, int count)
{
    t_listelem *vec = x->l_vec + offset;
    while (count--)
    {
        if (vec->l_a.a_type == A_POINTER)
            vec->l_a.a_w.w_gpointer = &vec->l_p;
        vec++;
    }
}